

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall
rlottie::internal::renderer::Group::processTrimItems
          (Group *this,
          vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
          *list)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  Group *this_00;
  iterator __position;
  uint uVar4;
  Group *in_RAX;
  pointer ppOVar5;
  Group *local_38;
  
  ppOVar5 = (this->mContents).
            super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar5 !=
      (this->mContents).
      super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppSVar2 = (list->
              super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    ppSVar3 = (list->
              super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_38 = in_RAX;
    do {
      this_00 = (Group *)ppOVar5[-1];
      uVar4 = (*(this_00->super_Object)._vptr_Object[5])(this_00);
      if ((char)uVar4 == '\x01') {
        processTrimItems(this_00,list);
      }
      else if ((uVar4 & 0xff) == 4) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<rlottie::internal::renderer::Shape**,std::back_insert_iterator<std::vector<rlottie::internal::renderer::Shape*,std::allocator<rlottie::internal::renderer::Shape*>>>>
                  ((Shape **)
                   ((long)ppSVar2 +
                   ((long)(list->
                          super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
                          )._M_impl.super__Vector_impl_data._M_start - (long)ppSVar3)),
                   (list->
                   super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   (back_insert_iterator<std::vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>_>
                    )&(this_00->mContents).
                      super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if ((uVar4 & 0xff) == 2) {
        __position._M_current =
             (list->
             super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_38 = this_00;
        if (__position._M_current ==
            (list->
            super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<rlottie::internal::renderer::Shape*,std::allocator<rlottie::internal::renderer::Shape*>>
          ::_M_realloc_insert<rlottie::internal::renderer::Shape*>
                    ((vector<rlottie::internal::renderer::Shape*,std::allocator<rlottie::internal::renderer::Shape*>>
                      *)list,__position,(Shape **)&local_38);
        }
        else {
          *__position._M_current = (Shape *)this_00;
          pppSVar1 = &(list->
                      super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
      }
      ppOVar5 = ppOVar5 + -1;
    } while (ppOVar5 !=
             (this->mContents).
             super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void renderer::Group::renderList(std::vector<VDrawable *> &list)
{
    for (const auto &content : mContents) {
        content->renderList(list);
    }
}